

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_join_leave.cxx
# Opt level: O3

void __thiscall nuraft::raft_server::handle_leave_cluster_resp(raft_server *this,resp_msg *resp)

{
  element_type *peVar1;
  int iVar2;
  string local_40;
  
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (resp->accepted_ == false) {
    if (peVar1 != (element_type *)0x0) {
      iVar2 = (*peVar1->_vptr_logger[7])();
      if (4 < iVar2) {
        peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_(&local_40,"peer doesn\'t accept to stepping down, stop proceeding");
        (*peVar1->_vptr_logger[8])
                  (peVar1,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                   ,"handle_leave_cluster_resp",0x1d7,&local_40);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != &local_40.field_2) {
          operator_delete(local_40._M_dataplus._M_p);
        }
      }
    }
  }
  else {
    if (peVar1 != (element_type *)0x0) {
      iVar2 = (*peVar1->_vptr_logger[7])();
      if (4 < iVar2) {
        peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  (&local_40,"peer accepted to stepping down, removing this server from cluster");
        (*peVar1->_vptr_logger[8])
                  (peVar1,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                   ,"handle_leave_cluster_resp",0x1db,&local_40);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != &local_40.field_2) {
          operator_delete(local_40._M_dataplus._M_p);
        }
      }
    }
    rm_srv_from_cluster(this,(resp->super_msg_base).src_);
  }
  return;
}

Assistant:

void raft_server::handle_leave_cluster_resp(resp_msg& resp) {
    if (!resp.get_accepted()) {
        p_db("peer doesn't accept to stepping down, stop proceeding");
        return;
    }

    p_db("peer accepted to stepping down, removing this server from cluster");
    rm_srv_from_cluster(resp.get_src());
}